

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_runner.cpp
# Opt level: O2

void __thiscall
duckdb::SQLLogicTestRunner::SQLLogicTestRunner(SQLLogicTestRunner *this,string *dbpath)

{
  unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true> *this_00;
  __uniq_ptr_impl<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_> __p;
  DBConfig DVar1;
  pointer pDVar2;
  char *pcVar3;
  long lVar4;
  undefined1 local_ac;
  undefined1 local_ab;
  allocator local_aa;
  allocator local_a9 [16];
  undefined1 local_99;
  string *local_98;
  string *local_78;
  __uniq_ptr_impl<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_> local_70 [4];
  string local_50 [32];
  
  this->_vptr_SQLLogicTestRunner = (_func_int **)&PTR_LoadDatabase_00579e20;
  local_78 = &this->dbpath;
  std::__cxx11::string::string((string *)local_78,(string *)dbpath);
  this_00 = &this->config;
  (this->con).super_unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>_>._M_t.
  super___uniq_ptr_impl<duckdb::Connection,_std::default_delete<duckdb::Connection>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Connection_*,_std::default_delete<duckdb::Connection>_>.
  super__Head_base<0UL,_duckdb::Connection_*,_false>._M_head_impl = (Connection *)0x0;
  (this->config).super_unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_>._M_t.
  super___uniq_ptr_impl<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DBConfig_*,_std::default_delete<duckdb::DBConfig>_>.
  super__Head_base<0UL,_duckdb::DBConfig_*,_false>._M_head_impl = (DBConfig *)0x0;
  (this->loaded_databases).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->db).super_unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>._M_t.
  super___uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DuckDB_*,_std::default_delete<duckdb::DuckDB>_>.
  super__Head_base<0UL,_duckdb::DuckDB_*,_false>._M_head_impl = (DuckDB *)0x0;
  (this->loaded_databases).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loaded_databases).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extensions)._M_h._M_buckets = &(this->extensions)._M_h._M_single_bucket;
  (this->extensions)._M_h._M_bucket_count = 1;
  (this->extensions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->extensions)._M_h._M_element_count = 0;
  (this->extensions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->extensions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->extensions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->named_connection_map)._M_h._M_buckets = &(this->named_connection_map)._M_h._M_single_bucket
  ;
  (this->named_connection_map)._M_h._M_bucket_count = 1;
  (this->named_connection_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->named_connection_map)._M_h._M_element_count = 0;
  (this->named_connection_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->named_connection_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->named_connection_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->output_hash_mode = false;
  this->output_result_mode = false;
  this->debug_mode = false;
  this->finished_processing_file = (__atomic_base<bool>)0x0;
  this->hash_threshold = 0;
  (this->active_loops).super_vector<duckdb::LoopCommand_*,_std::allocator<duckdb::LoopCommand_*>_>.
  super__Vector_base<duckdb::LoopCommand_*,_std::allocator<duckdb::LoopCommand_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->active_loops).super_vector<duckdb::LoopCommand_*,_std::allocator<duckdb::LoopCommand_*>_>.
  super__Vector_base<duckdb::LoopCommand_*,_std::allocator<duckdb::LoopCommand_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->active_loops).super_vector<duckdb::LoopCommand_*,_std::allocator<duckdb::LoopCommand_*>_>.
  super__Vector_base<duckdb::LoopCommand_*,_std::allocator<duckdb::LoopCommand_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->active_loops).
           super_vector<duckdb::LoopCommand_*,_std::allocator<duckdb::LoopCommand_*>_>.
           super__Vector_base<duckdb::LoopCommand_*,_std::allocator<duckdb::LoopCommand_*>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->top_level_loop).
           super_unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>_>._M_t.
           super___uniq_ptr_impl<duckdb::Command,_std::default_delete<duckdb::Command>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Command_*,_std::default_delete<duckdb::Command>_>.
           super__Head_base<0UL,_duckdb::Command_*,_false> + 4) = 0;
  (this->environment_variables)._M_h._M_buckets =
       &(this->environment_variables)._M_h._M_single_bucket;
  (this->environment_variables)._M_h._M_bucket_count = 1;
  (this->environment_variables)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->environment_variables)._M_h._M_element_count = 0;
  (this->environment_variables)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->environment_variables)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->environment_variables)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_98 = &this->local_extension_repo;
  (this->local_extension_repo)._M_dataplus._M_p = (pointer)&(this->local_extension_repo).field_2;
  (this->local_extension_repo)._M_string_length = 0;
  (this->local_extension_repo).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)local_70,"HTTP",local_a9);
  std::__cxx11::string::string(local_50,"Unable to connect",&local_aa);
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<std::__cxx11::string_const*>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->ignore_error_messages,local_70,&stack0xffffffffffffffd0,0,&local_ab,&local_ac
             ,&local_99);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&local_70[0]._M_t.
                       super__Tuple_impl<0UL,_duckdb::DBConfig_*,_std::default_delete<duckdb::DBConfig>_>
                       .super__Head_base<0UL,_duckdb::DBConfig_*,_false>._M_head_impl + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  std::__cxx11::string::string((string *)local_70,"differs from original result!",local_a9);
  std::__cxx11::string::string(local_50,"INTERNAL",&local_aa);
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<std::__cxx11::string_const*>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->always_fail_error_messages,local_70,&stack0xffffffffffffffd0,0,&local_ab,
             &local_ac,&local_99);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&local_70[0]._M_t.
                       super__Tuple_impl<0UL,_duckdb::DBConfig_*,_std::default_delete<duckdb::DBConfig>_>
                       .super__Head_base<0UL,_duckdb::DBConfig_*,_false>._M_head_impl + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  (this->hash_label_map)._M_h._M_buckets = &(this->hash_label_map)._M_h._M_single_bucket;
  (this->hash_label_map)._M_h._M_bucket_count = 1;
  (this->hash_label_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->hash_label_map)._M_h._M_element_count = 0;
  (this->hash_label_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->hash_label_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->hash_label_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->result_label_map)._M_h._M_buckets = &(this->result_label_map)._M_h._M_single_bucket;
  (this->result_label_map)._M_h._M_bucket_count = 1;
  (this->result_label_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->result_label_map)._M_h._M_element_count = 0;
  (this->result_label_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->result_label_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->result_label_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->log_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->log_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->log_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->log_lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  (this->log_lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  GetTestConfig();
  __p._M_t.super__Tuple_impl<0UL,_duckdb::DBConfig_*,_std::default_delete<duckdb::DBConfig>_>.
  super__Head_base<0UL,_duckdb::DBConfig_*,_false>._M_head_impl =
       local_70[0]._M_t.
       super__Tuple_impl<0UL,_duckdb::DBConfig_*,_std::default_delete<duckdb::DBConfig>_>.
       super__Head_base<0UL,_duckdb::DBConfig_*,_false>._M_head_impl;
  local_70[0]._M_t.
  super__Tuple_impl<0UL,_duckdb::DBConfig_*,_std::default_delete<duckdb::DBConfig>_>.
  super__Head_base<0UL,_duckdb::DBConfig_*,_false>._M_head_impl =
       (tuple<duckdb::DBConfig_*,_std::default_delete<duckdb::DBConfig>_>)
       (_Tuple_impl<0UL,_duckdb::DBConfig_*,_std::default_delete<duckdb::DBConfig>_>)0x0;
  std::__uniq_ptr_impl<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_>::reset
            ((__uniq_ptr_impl<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_> *)this_00,
             (pointer)__p._M_t.
                      super__Tuple_impl<0UL,_duckdb::DBConfig_*,_std::default_delete<duckdb::DBConfig>_>
                      .super__Head_base<0UL,_duckdb::DBConfig_*,_false>._M_head_impl);
  std::unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_>::~unique_ptr
            ((unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>_> *)local_70);
  pDVar2 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                     (this_00);
  pDVar2[0x172] = (DBConfig)0x1;
  pDVar2 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                     (this_00);
  pDVar2[0xe1] = (DBConfig)0x0;
  pcVar3 = getenv("LOCAL_EXTENSION_REPO");
  if (pcVar3 == (char *)0x0) {
    pDVar2 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (this_00);
  }
  else {
    std::__cxx11::string::assign((char *)local_98);
    pDVar2 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (this_00);
  }
  pDVar2[0xe2] = (DBConfig)(pcVar3 != (char *)0x0);
  pcVar3 = getenv("DUCKDB_DEBUG_VERIFY_VECTOR");
  if (pcVar3 != (char *)0x0) {
    DVar1 = (DBConfig)duckdb::EnumUtil::FromString<duckdb::DebugVectorVerification>(pcVar3);
    pDVar2 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (this_00);
    pDVar2[0x461] = DVar1;
  }
  return;
}

Assistant:

SQLLogicTestRunner::SQLLogicTestRunner(string dbpath) : dbpath(std::move(dbpath)), finished_processing_file(false) {
	config = GetTestConfig();
	config->options.allow_unredacted_secrets = true;
	config->options.load_extensions = false;

	auto env_var = std::getenv("LOCAL_EXTENSION_REPO");
	if (!env_var) {
		config->options.autoload_known_extensions = false;
	} else {
		local_extension_repo = env_var;
		config->options.autoload_known_extensions = true;
	}
	auto verify_vector = std::getenv("DUCKDB_DEBUG_VERIFY_VECTOR");
	if (verify_vector) {
		config->options.debug_verify_vector = EnumUtil::FromString<DebugVectorVerification>(verify_vector);
	}
}